

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_platform_sdl2.c
# Opt level: O0

FAudioIOStream * FAudio_fopen(char *path)

{
  FAudioIOStream *pFVar1;
  void *pvVar2;
  FAudioMutex pvVar3;
  undefined8 in_RDI;
  SDL_RWops *rwops;
  FAudioIOStream *io;
  
  pFVar1 = (FAudioIOStream *)SDL_malloc(0x28);
  pvVar2 = (void *)SDL_RWFromFile(in_RDI,"rb");
  pFVar1->data = pvVar2;
  pFVar1->read = *(FAudio_readfunc *)((long)pvVar2 + 0x10);
  pFVar1->seek = *(FAudio_seekfunc *)((long)pvVar2 + 8);
  pFVar1->close = *(FAudio_closefunc *)((long)pvVar2 + 0x20);
  pvVar3 = FAudio_PlatformCreateMutex();
  pFVar1->lock = pvVar3;
  return pFVar1;
}

Assistant:

FAudioIOStream* FAudio_fopen(const char *path)
{
	FAudioIOStream *io = (FAudioIOStream*) FAudio_malloc(
		sizeof(FAudioIOStream)
	);
	SDL_RWops *rwops = SDL_RWFromFile(path, "rb");
	io->data = rwops;
	io->read = (FAudio_readfunc) rwops->read;
	io->seek = (FAudio_seekfunc) rwops->seek;
	io->close = (FAudio_closefunc) rwops->close;
	io->lock = FAudio_PlatformCreateMutex();
	return io;
}